

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_def_io.c
# Opt level: O1

int32 model_def_read(model_def_t **out_model_def,char *file_name)

{
  long lVar1;
  char **ppcVar2;
  int iVar3;
  uint uVar4;
  acmod_id_t aVar5;
  int iVar6;
  int32 iVar7;
  FILE *__stream;
  lineiter_t *plVar8;
  ci_acmod_t *pcVar9;
  acmod_set_t *paVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  uint32 uVar17;
  ulong uVar18;
  uint32 n_ci;
  bool bVar19;
  undefined1 auVar20 [16];
  uint32 n_state;
  uint32 n;
  uint32 tmat;
  char tag [32];
  uint32 state [20];
  char *in_stack_fffffffffffffec8;
  undefined4 uVar21;
  acmod_id_t local_124;
  uint32 local_120;
  uint local_11c;
  ci_acmod_t *local_118;
  lineiter_t *local_110;
  acmod_set_t *local_108;
  uint local_100;
  uint32 local_fc;
  ulong local_f8;
  FILE *local_f0;
  ulong local_e8;
  ulong local_e0;
  char **local_d8;
  acmod_id_t local_d0;
  acmod_id_t local_cc;
  char local_c8;
  char cStack_c7;
  char cStack_c6;
  char cStack_c5;
  char cStack_c4;
  char cStack_c3;
  char cStack_c2;
  char cStack_c1;
  char cStack_c0;
  char cStack_bf;
  char cStack_be;
  char cStack_bd;
  char cStack_bc;
  char cStack_bb;
  char cStack_ba;
  char cStack_b9;
  ulong local_a0;
  void *local_98;
  char **local_90;
  uint32 local_88 [22];
  
  __stream = fopen(file_name,"r");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                   ,0x19d,"Unable to open %s for reading",file_name);
    return -1;
  }
  plVar8 = lineiter_start_clean((FILE *)__stream);
  if (plVar8 == (lineiter_t *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
            ,0x1a6,"ERROR not even a version number in %s!?\n",file_name);
LAB_00105531:
    fclose(__stream);
    plVar8 = (lineiter_t *)0x0;
  }
  else {
    pcVar12 = plVar8->buf;
    iVar3 = strcmp(pcVar12,"0.3");
    if (iVar3 == 0) {
      local_e8 = 0xffffffff;
      iVar3 = 6;
      local_e0 = 0xffffffff;
      local_100 = 0xffffffff;
      local_124 = 0xffffffff;
      local_110 = (lineiter_t *)CONCAT44(local_110._4_4_,0xffffffff);
      local_f8 = CONCAT44(local_f8._4_4_,0xffffffff);
      local_108 = (acmod_set_t *)out_model_def;
      local_f0 = __stream;
      do {
        plVar8 = lineiter_next(plVar8);
        if (plVar8 == (lineiter_t *)0x0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                  ,0x1c5,"Incomplete count information in %s!?\n",file_name);
          __stream = local_f0;
          goto LAB_00105531;
        }
        __isoc99_sscanf(plVar8->buf,"%u %s",&local_11c,&local_c8);
        if (CONCAT13(cStack_c2,CONCAT12(cStack_c3,CONCAT11(cStack_c4,cStack_c5))) == 0x657361 &&
            CONCAT13(cStack_c5,CONCAT12(cStack_c6,CONCAT11(cStack_c7,local_c8))) == 0x61625f6e) {
          local_e0 = (ulong)local_11c;
        }
        else if (CONCAT11(cStack_c3,cStack_c4) == 0x69 &&
                 CONCAT13(cStack_c5,CONCAT12(cStack_c6,CONCAT11(cStack_c7,local_c8))) == 0x72745f6e)
        {
          local_e8 = (ulong)local_11c;
        }
        else if (CONCAT13(cStack_bd,CONCAT12(cStack_be,CONCAT11(cStack_bf,cStack_c0))) == 0x70616d
                 && CONCAT17(cStack_c1,
                             CONCAT16(cStack_c2,
                                      CONCAT15(cStack_c3,
                                               CONCAT14(cStack_c4,
                                                        CONCAT13(cStack_c5,
                                                                 CONCAT12(cStack_c6,
                                                                          CONCAT11(cStack_c7,
                                                                                   local_c8)))))))
                    == 0x5f65746174735f6e) {
          local_100 = local_11c;
        }
        else if (CONCAT17(cStack_bc,
                          CONCAT16(cStack_bd,
                                   CONCAT15(cStack_be,
                                            CONCAT14(cStack_bf,
                                                     CONCAT13(cStack_c0,
                                                              CONCAT12(cStack_c1,
                                                                       CONCAT11(cStack_c2,cStack_c3)
                                                                      )))))) == 0x65746174735f64 &&
                 CONCAT17(cStack_c1,
                          CONCAT16(cStack_c2,
                                   CONCAT15(cStack_c3,
                                            CONCAT14(cStack_c4,
                                                     CONCAT13(cStack_c5,
                                                              CONCAT12(cStack_c6,
                                                                       CONCAT11(cStack_c7,local_c8))
                                                             ))))) == 0x735f646569745f6e) {
          local_124 = local_11c;
        }
        else {
          auVar20[0] = -(local_c8 == 'n');
          auVar20[1] = -(cStack_c7 == '_');
          auVar20[2] = -(cStack_c6 == 't');
          auVar20[3] = -(cStack_c5 == 'i');
          auVar20[4] = -(cStack_c4 == 'e');
          auVar20[5] = -(cStack_c3 == 'd');
          auVar20[6] = -(cStack_c2 == '_');
          auVar20[7] = -(cStack_c1 == 'c');
          auVar20[8] = -(cStack_c0 == 'i');
          auVar20[9] = -(cStack_bf == '_');
          auVar20[10] = -(cStack_be == 's');
          auVar20[0xb] = -(cStack_bd == 't');
          auVar20[0xc] = -(cStack_bc == 'a');
          auVar20[0xd] = -(cStack_bb == 't');
          auVar20[0xe] = -(cStack_ba == 'e');
          auVar20[0xf] = -(cStack_b9 == '\0');
          if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar20[0xf] >> 7) << 0xf) == 0xffff) {
            local_f8 = CONCAT44(local_f8._4_4_,local_11c);
          }
          else {
            if (CONCAT13(cStack_bd,CONCAT12(cStack_be,CONCAT11(cStack_bf,cStack_c0))) != 0x74616d ||
                CONCAT17(cStack_c1,
                         CONCAT16(cStack_c2,
                                  CONCAT15(cStack_c3,
                                           CONCAT14(cStack_c4,
                                                    CONCAT13(cStack_c5,
                                                             CONCAT12(cStack_c6,
                                                                      CONCAT11(cStack_c7,local_c8)))
                                                   )))) != 0x745f646569745f6e) {
              uVar4 = lineiter_lineno(plVar8);
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                      ,0x1e2,"Unknown tag %s in file at line %d\n",&local_c8,(ulong)uVar4);
              fclose(local_f0);
              goto LAB_00105538;
            }
            local_110 = (lineiter_t *)CONCAT44(local_110._4_4_,local_11c);
          }
        }
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      plVar8 = lineiter_next(plVar8);
      pcVar9 = (ci_acmod_t *)
               __ckd_calloc__(1,0x48,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                              ,0x1ec);
      local_108->ci = pcVar9;
      paVar10 = acmod_set_new();
      uVar16 = local_e0;
      pcVar9->name = (char *)paVar10;
      n_ci = (uint32)local_e0;
      acmod_set_set_n_ci_hint(paVar10,n_ci);
      uVar17 = (uint32)local_e8;
      local_108 = paVar10;
      acmod_set_set_n_tri_hint(paVar10,uVar17);
      local_a0 = (ulong)(uVar17 + n_ci);
      local_90 = (char **)__ckd_calloc__(local_a0,0x20,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                                         ,0x1f5);
      pcVar9->attrib = local_90;
      *(uint *)&pcVar9->field_0x14 = local_100;
      local_98 = __ckd_calloc__((ulong)local_100,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                                ,0x1f8);
      *(undefined4 *)&pcVar9[1].name = (undefined4)local_f8;
      *(acmod_id_t *)((long)&pcVar9[1].name + 4) = local_124;
      *(undefined4 *)&pcVar9[1].attrib = local_110._0_4_;
      *(undefined8 *)((long)&pcVar9[2].name + 4) = 0x1400000000;
      local_118 = pcVar9;
      if (n_ci == 0) {
        uVar18 = 0;
        uVar16 = 0;
      }
      else {
        local_f8 = uVar16 & 0xffffffff;
        uVar16 = 0;
        uVar18 = 0;
        do {
          local_120 = 0x14;
          pcVar12 = plVar8->buf;
          local_110 = plVar8;
          uVar4 = lineiter_lineno(plVar8);
          pcVar11 = strtok(pcVar12," \t");
          aVar5 = acmod_set_name2id(local_108,pcVar11);
          if (aVar5 == 0xffffffff) {
            iVar3 = 3;
            do {
              pcVar13 = strtok((char *)0x0," \t");
              iVar6 = strcmp("-",pcVar13);
              if (iVar6 != 0) {
                lVar14 = 0xae;
                pcVar13 = 
                "Expected l, r and posn to be \"-\" for ci phone %s at line %d, currently \'%s\'\n";
                in_stack_fffffffffffffec8 = pcVar12;
                goto LAB_0010544e;
              }
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
            iVar7 = parse_rem(&local_d8,&local_fc,local_88,&local_120,uVar4);
            if (iVar7 == 0) {
              local_124 = acmod_set_add_ci(local_108,pcVar11,local_d8);
              bVar19 = true;
            }
            else {
              bVar19 = false;
            }
          }
          else {
            lVar14 = 0xa7;
            pcVar13 = "%s multiply defined at line %d\n";
LAB_0010544e:
            bVar19 = false;
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                    ,lVar14,pcVar13,pcVar11,(ulong)uVar4);
          }
          ppcVar2 = local_90;
          uVar17 = local_120;
          if (!bVar19) goto LAB_001058fb;
          *(acmod_id_t *)(local_90 + uVar16 * 4) = local_124;
          *(uint32 *)((long)local_90 + uVar16 * 0x20 + 4) = local_fc;
          *(uint32 *)(local_90 + uVar16 * 4 + 2) = local_120;
          pcVar12 = (char *)((long)local_98 + uVar18 * 4);
          local_90[uVar16 * 4 + 1] = pcVar12;
          memcpy(pcVar12,local_88,(ulong)local_120 << 2);
          uVar4 = *(uint *)(ppcVar2 + uVar16 * 4 + 2);
          if (*(uint *)((long)&local_118[2].name + 4) < uVar4) {
            *(uint *)((long)&local_118[2].name + 4) = uVar4;
          }
          if (uVar4 < *(uint *)&local_118[2].attrib) {
            *(uint *)&local_118[2].attrib = uVar4;
          }
          plVar8 = lineiter_next(local_110);
          uVar16 = uVar16 + 1;
          uVar18 = (ulong)((int)uVar18 + uVar17);
        } while (uVar16 != local_f8);
      }
      uVar21 = (undefined4)((ulong)in_stack_fffffffffffffec8 >> 0x20);
      uVar4 = (uint)uVar18;
      pcVar9 = local_118;
      if ((uint)uVar16 < (uint)local_a0) {
        uVar16 = uVar16 & 0xffffffff;
        local_f8 = local_a0 & 0xffffffff;
        paVar10 = local_108;
        do {
          local_120 = 0x14;
          pcVar12 = plVar8->buf;
          local_110 = plVar8;
          uVar4 = lineiter_lineno(plVar8);
          pcVar12 = strtok(pcVar12," \t");
          aVar5 = acmod_set_name2id(paVar10,pcVar12);
          if (aVar5 == 0xffffffff) {
            lVar14 = 0xd0;
            pcVar11 = "%s is an undefined base phone at line %d\n";
LAB_001056bf:
            bVar19 = false;
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                    ,lVar14,pcVar11,pcVar12,(ulong)uVar4);
          }
          else {
            local_cc = aVar5;
            pcVar12 = strtok((char *)0x0," \t");
            aVar5 = acmod_set_name2id(paVar10,pcVar12);
            if (aVar5 == 0xffffffff) {
              lVar14 = 0xda;
LAB_001056a6:
              pcVar11 = "%s is an undefined base phone at line %d\n";
              goto LAB_001056bf;
            }
            local_d0 = aVar5;
            pcVar12 = strtok((char *)0x0," \t");
            aVar5 = acmod_set_name2id(paVar10,pcVar12);
            if (aVar5 == 0xffffffff) {
              lVar14 = 0xe4;
              goto LAB_001056a6;
            }
            lVar14 = 0;
            pcVar12 = strtok((char *)0x0," \t");
            if (*pcVar12 != 'b') {
              lVar15 = 0;
              do {
                if (lVar15 == 4) {
                  lVar14 = 0xf5;
                  pcVar11 = "Unknown word posn %s found at line %d\n";
                  goto LAB_001056bf;
                }
                lVar14 = lVar15 + 1;
                lVar1 = lVar15 + 1;
                lVar15 = lVar14;
              } while (*pcVar12 != "besiu"[lVar1]);
            }
            iVar7 = parse_rem(&local_d8,&local_fc,local_88,&local_120,uVar4);
            if (iVar7 == 0) {
              local_124 = acmod_set_add_tri(local_108,local_cc,local_d0,aVar5,(word_posn_t)lVar14,
                                            local_d8);
              bVar19 = local_124 != 0xffffffff;
            }
            else {
              bVar19 = false;
            }
          }
          ppcVar2 = local_90;
          pcVar9 = local_118;
          if (!bVar19) goto LAB_001058fb;
          *(acmod_id_t *)(local_90 + uVar16 * 4) = local_124;
          *(uint32 *)((long)local_90 + uVar16 * 0x20 + 4) = local_fc;
          *(uint32 *)(local_90 + uVar16 * 4 + 2) = local_120;
          pcVar12 = (char *)((long)local_98 + uVar18 * 4);
          local_90[uVar16 * 4 + 1] = pcVar12;
          memcpy(pcVar12,local_88,(ulong)local_120 << 2);
          paVar10 = local_108;
          uVar4 = *(uint *)(ppcVar2 + uVar16 * 4 + 2);
          if (*(uint *)((long)&pcVar9[2].name + 4) < uVar4) {
            *(uint *)((long)&pcVar9[2].name + 4) = uVar4;
          }
          if (uVar4 < *(uint *)&pcVar9[2].attrib) {
            *(uint *)&pcVar9[2].attrib = uVar4;
          }
          plVar8 = lineiter_next(local_110);
          uVar21 = (undefined4)((ulong)in_stack_fffffffffffffec8 >> 0x20);
          uVar16 = uVar16 + 1;
          uVar4 = (int)uVar18 + local_120;
          uVar18 = (ulong)uVar4;
        } while (uVar16 != local_f8);
      }
      *(int *)&pcVar9->id = (int)local_a0;
      if (uVar4 != local_100) {
        __assert_fail("j == n_total_map",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                      ,0x23b,"int32 model_def_read(model_def_t **, const char *)");
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
              ,0x23d,"Model definition info:\n");
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
              ,0x23e,"%u total models defined (%u base, %u tri)\n",(ulong)*(uint *)&pcVar9->id,
              local_e0,CONCAT44(uVar21,(int)local_e8));
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
              ,0x23f,"%u total states\n",(ulong)*(uint *)&pcVar9->field_0x14);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
              ,0x240,"%u total tied states\n",(ulong)*(uint *)((long)&pcVar9[1].name + 4));
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
              ,0x241,"%u total tied CI states\n",(ulong)*(uint *)&pcVar9[1].name);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
              ,0x242,"%u total tied transition matrices\n",(ulong)*(uint *)&pcVar9[1].attrib);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
              ,0x243,"%u max state/model\n",(ulong)*(uint *)((long)&pcVar9[2].name + 4));
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
              ,0x244,"%u min state/model\n",(ulong)*(uint *)&pcVar9[2].attrib);
      fclose(local_f0);
      lineiter_free(plVar8);
      return 0;
    }
    iVar3 = lineiter_lineno(plVar8);
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
            ,0x1b0,"ERROR version(%s) == \"%s\", but expected %s at line %d.\n",file_name,pcVar12,
            "0.3",iVar3);
    fclose(__stream);
    iVar3 = strcmp(plVar8->buf,"0.1");
    if (iVar3 == 0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
              ,0x1b5,
              "You must add an attribute field to all the model records.  See SPHINX-III File Formats manual\n"
             );
    }
    iVar3 = strcmp(plVar8->buf,"0.2");
    if (iVar3 == 0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
              ,0x1b9,
              "You must add n_tied_state, n_tied_ci_state and n_tied_tmat definitions at the head of the file.  See /net/alf19/usr2/eht/s3/cvtmdef.csh\n"
             );
    }
  }
LAB_00105538:
  lineiter_free(plVar8);
  return -1;
LAB_001058fb:
  fclose(local_f0);
  plVar8 = local_110;
  goto LAB_00105538;
}

Assistant:

int32
model_def_read(model_def_t **out_model_def,
	       const char *file_name)
{
    lineiter_t *li = NULL;
    uint32 n;
    char tag[32];
    acmod_set_t *acmod_set;
    uint32 i, j;
    acmod_id_t acmod_id;
    uint32 tmat;
    uint32 n_state;
    uint32 n_tri;
    uint32 n_base;
    uint32 n_total_map;
    uint32 n_tied_state;
    uint32 n_tied_ci_state;
    uint32 n_tied_tmat;
    uint32 state[MAX_N_STATE];
    uint32 n_total;
    model_def_t *omd;
    model_def_entry_t *mdef;
    uint32 *all_state;
    uint32 max_tmat;
    uint32 max_state;
    uint32 max_ci_state;
    
    FILE *fp;

    fp = fopen(file_name, "r");
    if (fp == NULL) {
	E_ERROR_SYSTEM("Unable to open %s for reading",
		      file_name);

	return S3_ERROR;
    }
    
    li = lineiter_start_clean(fp);

    if (li == NULL) {
	E_ERROR("ERROR not even a version number in %s!?\n",
		file_name);

	fclose(fp);

        lineiter_free(li);
	return S3_ERROR;
    }

    if (strcmp(li->buf, MODEL_DEF_VERSION) != 0) {
	E_ERROR("ERROR version(%s) == \"%s\", but expected %s at line %d.\n",
		file_name, li->buf, MODEL_DEF_VERSION, lineiter_lineno(li));

	fclose(fp);
	
	if (strcmp(li->buf, "0.1") == 0) {
	    E_ERROR("You must add an attribute field to all the model records.  See SPHINX-III File Formats manual\n");
	}
	
	if (strcmp(li->buf, "0.2") == 0) {
	    E_ERROR("You must add n_tied_state, n_tied_ci_state and n_tied_tmat definitions at the head of the file.  See /net/alf19/usr2/eht/s3/cvtmdef.csh\n");
	}
	
        lineiter_free(li);
	return S3_ERROR;
    }

    n_tri = n_base = n_total_map = n_tied_state = n_tied_ci_state = n_tied_tmat = NO_NUMBER;
    for ( i = 0; i < 6; i++) {
        li = lineiter_next(li);
        if (li == NULL) {
	    E_ERROR("Incomplete count information in %s!?\n",
		    file_name);
	    
	    fclose(fp);
            lineiter_free(li);
	    return S3_ERROR;
	}

	sscanf(li->buf, "%u %s", &n, tag);

	if (strcmp(tag, "n_base") == 0) {
	    n_base = n;
	}	
	else if (strcmp(tag, "n_tri") == 0) {
	    n_tri = n;
	}
	else if (strcmp(tag, "n_state_map") == 0) {
	    n_total_map = n;
	}
	else if (strcmp(tag, "n_tied_state") == 0) {
	    n_tied_state = n;
	}
	else if (strcmp(tag, "n_tied_ci_state") == 0) {
	    n_tied_ci_state = n;
	}
	else if (strcmp(tag, "n_tied_tmat") == 0) {
	    n_tied_tmat = n;
	}
	else {
	    E_ERROR("Unknown tag %s in file at line %d\n",
		    tag, lineiter_lineno(li));
	    	    
	    fclose(fp);

            lineiter_free(li);
	    return S3_ERROR;
	}
    }
    li = lineiter_next(li);

    *out_model_def = omd = ckd_calloc(1, sizeof(model_def_t));
    omd->acmod_set = acmod_set = acmod_set_new();

    /* give the acmod_set module some storage allocation requirements */
    acmod_set_set_n_ci_hint(acmod_set, n_base);
    acmod_set_set_n_tri_hint(acmod_set, n_tri);

    n_total = n_base + n_tri;

    omd->defn = mdef = ckd_calloc(n_total, sizeof(model_def_entry_t));
    omd->n_total_state = n_total_map;

    all_state = ckd_calloc(n_total_map, sizeof(uint32));
    
    omd->n_tied_ci_state = n_tied_ci_state;
    omd->n_tied_state = n_tied_state;
    omd->n_tied_tmat = n_tied_tmat;

    omd->max_n_state = 0;
    omd->min_n_state = MAX_N_STATE;

    for (i = 0, j = 0, max_state = 0, max_ci_state = 0, max_tmat = 0;
	 i < n_base; i++, j += n_state) {
	n_state = MAX_N_STATE;
	if (parse_base_line(li->buf,
			    lineiter_lineno(li),
	                    &acmod_id,
			    &tmat,
			    state,
			    &n_state,
			    acmod_set) != S3_SUCCESS) {

	    fclose(fp);
            lineiter_free(li);
            return S3_ERROR;
	}

	mdef[i].p = acmod_id;
	mdef[i].tmat = tmat;
	mdef[i].n_state = n_state;
	mdef[i].state = &all_state[j];

	memcpy((char *)mdef[i].state, (const char *)state,
	       n_state * sizeof(uint32));

	update_totals(omd, &mdef[i]);

	li = lineiter_next(li);
    }

    for (; i < n_total; i++, j += n_state) {
	n_state = MAX_N_STATE;

	if (parse_tri_line(li->buf,
			   lineiter_lineno(li),
			   &acmod_id,
			   &tmat,
			   state,
			   &n_state,
			   acmod_set) != S3_SUCCESS) {
	    fclose(fp);
            lineiter_free(li);
	    return S3_ERROR;
	}

	mdef[i].p = acmod_id;
	mdef[i].tmat = tmat;
	mdef[i].n_state = n_state;
	mdef[i].state = &all_state[j];
	memcpy((char *)mdef[i].state,
	       (const char *)state,
	       n_state * sizeof(uint32));

	update_totals(omd, &mdef[i]);
	li = lineiter_next(li);
    }

    omd->n_defn = n_total;

    assert(j == n_total_map);
    
    E_INFO("Model definition info:\n");
    E_INFO("%u total models defined (%u base, %u tri)\n", omd->n_defn, n_base, n_tri);
    E_INFO("%u total states\n", omd->n_total_state);
    E_INFO("%u total tied states\n", omd->n_tied_state);
    E_INFO("%u total tied CI states\n", omd->n_tied_ci_state);
    E_INFO("%u total tied transition matrices\n", omd->n_tied_tmat);
    E_INFO("%u max state/model\n", omd->max_n_state);
    E_INFO("%u min state/model\n", omd->min_n_state);

    fclose(fp);

    lineiter_free(li);
    return S3_SUCCESS;
}